

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_6.cpp
# Opt level: O2

int main(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int *piVar5;
  int i;
  long lVar6;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_38 + 4));
  piVar5 = num;
  for (lVar6 = 0; lVar6 < (int)uStack_38._4_4_; lVar6 = lVar6 + 1) {
    std::istream::operator>>((istream *)&std::cin,piVar5);
    piVar5 = piVar5 + 1;
  }
  std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(num);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uStack_38._4_4_) {
    uVar3 = (ulong)uStack_38._4_4_;
  }
  uVar4 = 0;
  for (; lVar6 = (long)(int)uVar4, uVar3 != uVar2; uVar2 = uVar2 + 1) {
    if ((uVar2 != 0) && (num[uVar2] != (&DAT_0010407c)[uVar2])) {
      uVar4 = uVar4 + 1;
      ans[lVar6] = (&DAT_0010407c)[uVar2];
    }
  }
  piVar5 = ans;
  ans[lVar6] = (&DAT_0010407c)[(int)uStack_38._4_4_];
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4 + 1);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar2 = 0; (long)uVar2 <= lVar6; uVar2 = uVar2 + 1) {
    if (uVar4 == uVar2) {
      std::ostream::operator<<((ostream *)&std::cout,ans[uVar4]);
    }
    else {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
      std::operator<<(poVar1," ");
    }
    piVar5 = piVar5 + 1;
  }
  return 0;
}

Assistant:

int main()
{
    int n,m;
    cin >> n;
    for (int i = 0; i < n; ++i) {
        cin  >> num[i];
    }
    sort(num,num + n);
    m = 0;
    for (int j = 0; j < n; ++j) {
        if(j != 0 && num[j] != num[j-1] )
        ans[m++] = num[j-1];
    }
    ans[m++]  = num[n-1];
    cout << m <<endl;
    for (int k = 0; k < m; ++k) {
        if(k != m-1)
            cout << ans[k] << " ";
        else
            cout << ans[k];
    }
    return 0;
}